

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pocketsphinx.c
# Opt level: O3

int ps_add_jsgf_string(ps_decoder_t *ps,char *name,char *jsgf_string)

{
  int iVar1;
  jsgf_t *grammar;
  char *name_00;
  jsgf_rule_t *rule;
  fsg_model_t *fsg;
  double dVar2;
  
  grammar = jsgf_parse_string(jsgf_string,(jsgf_t *)0x0);
  if (grammar == (jsgf_t *)0x0) {
    return -1;
  }
  name_00 = ps_config_str(ps->config,"toprule");
  if (name_00 == (char *)0x0) {
    rule = jsgf_get_public_rule(grammar);
    if (rule == (jsgf_rule_t *)0x0) {
      err_msg(ERR_ERROR,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/pocketsphinx.c"
              ,0x35f,"No public rules found in input string\n");
      goto LAB_0010a36d;
    }
  }
  else {
    rule = jsgf_get_rule(grammar,name_00);
    if (rule == (jsgf_rule_t *)0x0) {
      err_msg(ERR_ERROR,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/pocketsphinx.c"
              ,0x358,"Start rule %s not found\n",name_00);
LAB_0010a36d:
      iVar1 = -1;
      goto LAB_0010a372;
    }
  }
  dVar2 = ps_config_float(ps->config,"lw");
  fsg = jsgf_build_fsg(grammar,rule,ps->lmath,(float32)(float)dVar2);
  iVar1 = ps_add_fsg(ps,name,fsg);
  fsg_model_free(fsg);
LAB_0010a372:
  jsgf_grammar_free(grammar);
  return iVar1;
}

Assistant:

int 
ps_add_jsgf_string(ps_decoder_t *ps, const char *name, const char *jsgf_string)
{
  fsg_model_t *fsg;
  jsgf_rule_t *rule;
  char const *toprule;
  jsgf_t *jsgf = jsgf_parse_string(jsgf_string, NULL);
  float lw;
  int result;

  if (!jsgf)
      return -1;

  rule = NULL;
  /* Take the -toprule if specified. */
  if ((toprule = ps_config_str(ps->config, "toprule"))) {
      rule = jsgf_get_rule(jsgf, toprule);
      if (rule == NULL) {
          E_ERROR("Start rule %s not found\n", toprule);
          jsgf_grammar_free(jsgf);
          return -1;
      }
  } else {
      rule = jsgf_get_public_rule(jsgf);
      if (rule == NULL) {
          E_ERROR("No public rules found in input string\n");
          jsgf_grammar_free(jsgf);
          return -1;
      }
  }

  lw = ps_config_float(ps->config, "lw");
  fsg = jsgf_build_fsg(jsgf, rule, ps->lmath, lw);
  result = ps_add_fsg(ps, name, fsg);
  fsg_model_free(fsg);
  jsgf_grammar_free(jsgf);
  return result;
}